

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O3

void x86_64_farith2(dill_stream s,int b1,int typ,int dest,int src)

{
  uint rex;
  int in_R9D;
  
  rex = (7 < src) + 4;
  if (dest < 8) {
    rex = (uint)(7 < src);
  }
  BYTE_OUT3R(s,(uint)(7 < dest) * 5,0xf,0x57,(dest & 7U) * 9 + 0xc0);
  BYTE_OUT1R3(s,typ == 10 ^ 0xf3,rex,0x5c,(src & 7U) + (dest & 7U) * 8 + 0xc0,in_R9D);
  return;
}

Assistant:

extern void
x86_64_farith2(dill_stream s, int b1, int typ, int dest, int src)
{
    /* this is fneg */
    int rex = 0;
    int op = 0xf3;
    if (src > XMM7)
        rex |= REX_B;
    if (dest > XMM7)
        rex |= REX_R;

    /* clear dest */
    {
        int rex1 = 0;
        if (dest > XMM7)
            rex1 = REX_R | REX_B;
        BYTE_OUT3R(s, rex1, 0x0f, 0x57,
                   ModRM(0x3, dest, dest));  // GSE really rex1?  Late fix.
    }
    if (typ == DILL_D)
        op = 0xf2;
    BYTE_OUT1R3(s, op, rex, 0x0f, 0x5c, ModRM(0x3, dest, src));
}